

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.h
# Opt level: O0

void __thiscall gui::TextBoxStyle::TextBoxStyle(TextBoxStyle *this,TextBoxStyle *param_2)

{
  Transformable *pTVar1;
  float fVar2;
  Text *in_RSI;
  RectangleShape *in_RDI;
  RectangleShape *in_stack_ffffffffffffffc8;
  Text *in_stack_ffffffffffffffe8;
  
  Style::Style((Style *)in_RDI,(Style *)in_RSI);
  (in_RDI->super_Shape).super_Drawable._vptr_Drawable = (_func_int **)&PTR__TextBoxStyle_002f7968;
  sf::RectangleShape::RectangleShape(in_RDI,in_stack_ffffffffffffffc8);
  sf::RectangleShape::RectangleShape
            (in_RDI,(RectangleShape *)&in_RDI[1].super_Shape.super_Transformable.m_origin);
  sf::Text::Text(in_RSI,in_stack_ffffffffffffffe8);
  *(undefined8 *)&in_RDI[3].super_Shape.super_Transformable.m_scale.y =
       *(undefined8 *)&in_RSI[2].m_bounds;
  fVar2 = in_RSI[2].m_bounds.height;
  pTVar1 = &in_RDI[3].super_Shape.super_Transformable;
  (pTVar1->m_transform).m_matrix[1] = in_RSI[2].m_bounds.width;
  (pTVar1->m_transform).m_matrix[2] = fVar2;
  *(undefined8 *)(in_RDI[3].super_Shape.super_Transformable.m_transform.m_matrix + 3) =
       *(undefined8 *)&in_RSI[2].m_geometryNeedUpdate;
  in_RDI[3].super_Shape.super_Transformable.m_transform.m_matrix[5] =
       *(float *)&in_RSI[2].m_fontTextureId;
  return;
}

Assistant:

virtual ~TextBoxStyle() = default;